

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::Grisu3Counted
               (double v,int requested_digits,Vector<char> buffer,int *length,int *decimal_exponent)

{
  bool bVar1;
  int *in_RSI;
  int *in_R8;
  DiyFp DVar2;
  Vector<char> in_stack_00000000;
  undefined1 in_stack_00000010 [16];
  int *in_stack_00000030;
  bool result;
  int kappa;
  DiyFp scaled_w;
  int ten_mk_maximal_binary_exponent;
  int ten_mk_minimal_binary_exponent;
  int mk;
  DiyFp ten_mk;
  DiyFp w;
  DiyFp *in_stack_ffffffffffffff18;
  Double *in_stack_ffffffffffffff20;
  Double *in_stack_ffffffffffffff30;
  DiyFp *this;
  int *in_stack_ffffffffffffff50;
  DiyFp *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_6c;
  DiyFp local_68;
  uint64_t local_58;
  int32_t local_50;
  DiyFp local_40;
  int *local_30;
  int in_stack_fffffffffffffffc;
  
  local_30 = in_R8;
  Double::Double(in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
  DVar2 = Double::AsNormalizedDiyFp(in_stack_ffffffffffffff30);
  local_58 = DVar2.f_;
  local_50 = DVar2.e_;
  local_40.f_ = local_58;
  local_40.e_ = local_50;
  DiyFp::DiyFp(&local_68);
  this = &local_40;
  DiyFp::e(this);
  DiyFp::e(this);
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange
            (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  DiyFp::Times(in_stack_ffffffffffffff18,(DiyFp *)0x383966);
  bVar1 = DigitGenCounted((DiyFp)in_stack_00000010,in_stack_fffffffffffffffc,in_stack_00000000,
                          in_RSI,in_stack_00000030);
  *local_30 = in_stack_ffffffffffffff64 - local_6c;
  return bVar1;
}

Assistant:

static bool Grisu3Counted(double v,
                          int requested_digits,
                          Vector<char> buffer,
                          int* length,
                          int* decimal_exponent) {
  DiyFp w = Double(v).AsNormalizedDiyFp();
  DiyFp ten_mk;  // Cached power of ten: 10^-k
  int mk;        // -k
  int ten_mk_minimal_binary_exponent =
     kMinimalTargetExponent - (w.e() + DiyFp::kSignificandSize);
  int ten_mk_maximal_binary_exponent =
     kMaximalTargetExponent - (w.e() + DiyFp::kSignificandSize);
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange(
      ten_mk_minimal_binary_exponent,
      ten_mk_maximal_binary_exponent,
      &ten_mk, &mk);
  DOUBLE_CONVERSION_ASSERT((kMinimalTargetExponent <= w.e() + ten_mk.e() +
          DiyFp::kSignificandSize) &&
         (kMaximalTargetExponent >= w.e() + ten_mk.e() +
          DiyFp::kSignificandSize));
  // Note that ten_mk is only an approximation of 10^-k. A DiyFp only contains a
  // 64 bit significand and ten_mk is thus only precise up to 64 bits.

  // The DiyFp::Times procedure rounds its result, and ten_mk is approximated
  // too. The variable scaled_w (as well as scaled_boundary_minus/plus) are now
  // off by a small amount.
  // In fact: scaled_w - w*10^k < 1ulp (unit in the last place) of scaled_w.
  // In other words: let f = scaled_w.f() and e = scaled_w.e(), then
  //           (f-1) * 2^e < w*10^k < (f+1) * 2^e
  DiyFp scaled_w = DiyFp::Times(w, ten_mk);

  // We now have (double) (scaled_w * 10^-mk).
  // DigitGen will generate the first requested_digits digits of scaled_w and
  // return together with a kappa such that scaled_w ~= buffer * 10^kappa. (It
  // will not always be exactly the same since DigitGenCounted only produces a
  // limited number of digits.)
  int kappa;
  bool result = DigitGenCounted(scaled_w, requested_digits,
                                buffer, length, &kappa);
  *decimal_exponent = -mk + kappa;
  return result;
}